

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1612e9d::AV1LbdInvTxfm2d_gt_int16_Test::~AV1LbdInvTxfm2d_gt_int16_Test
          (AV1LbdInvTxfm2d_gt_int16_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, gt_int16) {
  static const TxType types[] = { DCT_DCT, ADST_DCT, FLIPADST_DCT, IDTX,
                                  V_DCT,   H_DCT,    H_ADST,       H_FLIPADST };
  for (int j = 0; j < (int)(TX_SIZES_ALL); ++j) {
    const TxSize sz = static_cast<TxSize>(j);
    for (uint8_t i = 0; i < sizeof(types) / sizeof(types[0]); ++i) {
      const TxType tp = types[i];
      if (libaom_test::IsTxSizeTypeValid(sz, tp)) {
        RunAV1InvTxfm2dTest(tp, sz, 1, 1);
      }
    }
  }
}